

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::__encodeArray
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  pointer pvVar1;
  pointer __src;
  FastPForImpl<4U,_unsigned_long> *pFVar2;
  uint32_t *puVar3;
  uint32_t *out_00;
  ulong *puVar4;
  ulong *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint32_t bit;
  unsigned_long *puVar9;
  size_t nValue;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  size_t size;
  uint32_t k;
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  FastPForImpl<4U,_unsigned_long> *local_68;
  uint32_t *local_60;
  size_t *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  uint32_t *local_40;
  ulong local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  pvVar1 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = 8; lVar7 != 0x620; lVar7 = lVar7 + 0x18) {
    lVar12 = *(long *)((long)pvVar1 + lVar7 + -8);
    if (*(long *)((long)&(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data + lVar7) != lVar12) {
      *(long *)((long)&(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data + lVar7) = lVar12;
    }
  }
  out_00 = out + 1;
  puVar10 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_50 = in + length;
  local_68 = this;
  local_60 = out;
  while (puVar3 = local_60, pFVar2 = local_68, puVar9 = in + 0x80, puVar9 <= local_50) {
    getBestBFromData(local_68,in,&bestb,&bestcexcept,&maxb);
    *puVar10 = bestb;
    puVar10[1] = bestcexcept;
    if (bestcexcept == '\0') {
      puVar10 = puVar10 + 2;
    }
    else {
      uVar11 = (ulong)bestb;
      uVar8 = (ulong)maxb;
      puVar10[2] = maxb;
      puVar10 = puVar10 + 3;
      pvVar1 = (pFVar2->datatobepacked).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = puVar9;
      local_40 = out_00;
      for (lVar7 = 0; puVar9 = local_48, out_00 = local_40, lVar7 != 0x80; lVar7 = lVar7 + 1) {
        if (in[lVar7] >> (uVar11 & 0x3f) != 0) {
          local_38 = in[lVar7] >> ((ulong)bestb & 0x3f);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (pvVar1 + (uVar8 - uVar11),&local_38);
          *puVar10 = (uchar)lVar7;
          puVar10 = puVar10 + 1;
        }
      }
    }
    out_00 = packblockup<128u,unsigned_long>(in,out_00,(uint)bestb);
    in = puVar9;
  }
  *local_60 = (uint32_t)((ulong)((long)out_00 - (long)local_60) >> 2);
  __src = (local_68->bytescontainer).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar11 = (long)puVar10 - (long)__src;
  uVar8 = uVar11 & 0xffffffff;
  *out_00 = (uint32_t)uVar11;
  memcpy(out_00 + 1,__src,uVar8);
  puVar5 = (ulong *)((long)out_00 + (uVar8 + 3 & 0xfffffffffffffffc) + 4);
  for (puVar4 = (ulong *)((long)out_00 + uVar8 + 4); puVar4 < puVar5;
      puVar4 = (ulong *)((long)puVar4 + 1)) {
    *(undefined1 *)puVar4 = 0;
  }
  pvVar1 = (pFVar2->datatobepacked).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = 2;
  uVar8 = 0;
  for (lVar7 = 0x38; lVar7 != 0x620; lVar7 = lVar7 + 0x18) {
    uVar11 = 0;
    if (*(long *)((long)&(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data + lVar7) !=
        *(long *)((long)pvVar1 + lVar7 + -8)) {
      uVar11 = 1L << ((ulong)(iVar6 - 1) & 0x3f);
    }
    iVar6 = iVar6 + 1;
    uVar8 = uVar8 | uVar11;
  }
  *puVar5 = uVar8;
  puVar5 = puVar5 + 1;
  bit = 2;
  for (lVar7 = 0; lVar7 != 0x5e8; lVar7 = lVar7 + 0x18) {
    pvVar1 = (pFVar2->datatobepacked).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = *(long *)((long)&pvVar1[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + lVar7 + 8) -
             *(long *)((long)&pvVar1[2].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + lVar7);
    if (lVar12 != 0) {
      size = lVar12 >> 3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&pvVar1[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data + lVar7),size + 0x1f & 0xffffffffffffffe0)
      ;
      puVar5 = (ulong *)packingvector<32U>::packmeuptightwithoutmask<unsigned_long>
                                  (*(unsigned_long **)
                                    ((long)&(pFVar2->datatobepacked).
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data + lVar7),size,
                                   (uint32_t *)puVar5,bit);
    }
    bit = bit + 1;
  }
  *local_58 = (long)puVar5 - (long)puVar3 >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }